

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O0

void TRM::LinkedList<TRM::Edge>::Remove<&TRM::Edge::above_prev,&TRM::Edge::above_next>
               (Edge *t,Edge **head,Edge **tail)

{
  Edge **tail_local;
  Edge **head_local;
  Edge *t_local;
  
  if (t->above_prev == (Edge *)0x0) {
    if (head != (Edge **)0x0) {
      *head = t->above_next;
    }
  }
  else {
    t->above_prev->above_next = t->above_next;
  }
  if (t->above_next == (Edge *)0x0) {
    if (tail != (Edge **)0x0) {
      *tail = t->above_prev;
    }
  }
  else {
    t->above_next->above_prev = t->above_prev;
  }
  t->above_next = (Edge *)0x0;
  t->above_prev = (Edge *)0x0;
  return;
}

Assistant:

static void Remove(T* t, T** head, T** tail) {
    if (t->*Prev) {
      t->*Prev->*Next = t->*Next;
    } else if (head) {
      *head = t->*Next;
    }

    if (t->*Next) {
      t->*Next->*Prev = t->*Prev;
    } else if (tail) {
      *tail = t->*Prev;
    }

    t->*Prev = t->*Next = nullptr;
  }